

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

optional<google::protobuf::internal::DescriptorNames> __thiscall
google::protobuf::anon_unknown_24::
FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
::AllocateFieldNames
          (FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
           *this,string_view name,string_view scope,string *opt_json_name)

{
  char **this_00;
  initializer_list<unsigned_long> sizes;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> bytes;
  initializer_list<unsigned_long> sizes_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> bytes_00;
  initializer_list<unsigned_long> sizes_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> bytes_01;
  string_view name_00;
  bool bVar1;
  FieldNameCase FVar2;
  LogMessage *pLVar3;
  size_type sVar4;
  size_type sVar5;
  size_type sVar6;
  long lVar7;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  char *pcVar8;
  undefined1 lower_first;
  _Optional_payload_base<google::protobuf::internal::DescriptorNames> _Var9;
  optional<google::protobuf::internal::DescriptorNames> oVar10;
  string_view input;
  string_view input_00;
  string_view input_01;
  size_type local_3e0;
  long local_3d8;
  long local_3d0;
  undefined8 local_3c8;
  long local_3c0;
  undefined8 local_3b8;
  long local_3b0;
  undefined8 local_3a8;
  iterator local_3a0;
  undefined8 local_398;
  basic_string_view<char,_std::char_traits<char>_> local_390;
  string_view local_380;
  undefined1 local_370 [16];
  string_view local_360;
  undefined1 local_350 [16];
  string_view local_340;
  FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  *local_330;
  size_t sStack_328;
  size_t local_320;
  size_t sStack_318;
  char *local_310;
  char *pcStack_308;
  string_view local_300;
  iterator local_2f0;
  size_type local_2e8;
  long local_2e0;
  size_t offset;
  char *pcStack_2d0;
  undefined1 local_2c8 [8];
  string json_name;
  undefined1 local_298 [8];
  string camelcase_name;
  undefined1 local_270 [8];
  string lowercase_name;
  size_type local_240;
  long local_238;
  long local_230;
  size_type local_228;
  long local_220;
  undefined8 local_218;
  long local_210;
  undefined8 local_208;
  iterator local_200;
  undefined8 local_1f8;
  basic_string_view<char,_std::char_traits<char>_> local_1f0;
  string_view local_1e0;
  FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  *local_1d0;
  size_t sStack_1c8;
  size_t local_1c0;
  size_t sStack_1b8;
  char *local_1b0;
  char *pcStack_1a8;
  string_view local_1a0;
  iterator local_190;
  size_type local_188;
  long local_180;
  size_t camelcase_offset;
  char *pcStack_170;
  undefined1 local_168 [8];
  string camelcase_name_1;
  size_type local_140;
  long local_138;
  long local_130;
  size_type local_128;
  long local_120;
  size_type local_118;
  long local_110;
  size_type local_108;
  iterator local_100;
  undefined8 local_f8;
  basic_string_view<char,_std::char_traits<char>_> local_f0;
  size_t local_e0;
  size_t local_d8;
  char *local_d0;
  char *local_c8;
  size_t local_c0;
  char *local_b8;
  iterator local_b0;
  size_type local_a8;
  NoopDebugCounter local_99;
  char *local_98;
  char *pcStack_90;
  long local_80;
  size_t full_name_size;
  string_view scope_dot;
  LogMessage local_60;
  Voidify local_49;
  string *local_48;
  string *opt_json_name_local;
  FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  *this_local;
  string_view scope_local;
  string_view name_local;
  undefined1 local_10;
  
  pcVar8 = scope._M_str;
  this_local = (FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                *)scope._M_len;
  input._M_len = name._M_str;
  scope_local._M_str = (char *)name._M_len;
  local_48 = opt_json_name;
  opt_json_name_local = (string *)this;
  scope_local._M_len = (size_t)pcVar8;
  bVar1 = has_allocated(this);
  lower_first = SUB81(pcVar8,0);
  scope_dot._M_str._7_1_ = 0;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
               ,0x229,"has_allocated()");
    scope_dot._M_str._7_1_ = 1;
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_60);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_49,pLVar3);
  }
  if ((scope_dot._M_str._7_1_ & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_60);
  }
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  pcVar8 = ".";
  if (bVar1) {
    pcVar8 = "";
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&full_name_size,pcVar8);
  sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&full_name_size);
  sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&scope_local._M_str);
  local_80 = sVar4 + sVar5 + sVar6;
  if (local_48 == (string *)0x0) {
    local_98 = scope_local._M_str;
    name_00._M_str = input._M_len;
    name_00._M_len = (size_t)scope_local._M_str;
    pcStack_90 = input._M_len;
    FVar2 = GetFieldNameCase(this,name_00);
    if (FVar2 == 0) {
      internal::NoopDebugCounter::Inc(&local_99);
      local_f0._M_len = (size_t)this_local;
      local_f0._M_str = (char *)scope_local._M_len;
      local_e0 = full_name_size;
      local_d8 = scope_dot._M_len;
      local_d0 = scope_local._M_str;
      local_c0 = 1;
      local_b8 = "";
      local_b0 = &local_f0;
      local_a8 = 4;
      local_c8 = input._M_len;
      local_140 = std::basic_string_view<char,_std::char_traits<char>_>::size
                            ((basic_string_view<char,_std::char_traits<char>_> *)&scope_local._M_str
                            );
      local_138 = local_80;
      sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)&scope_local._M_str);
      local_130 = sVar4 + 1;
      local_128 = std::basic_string_view<char,_std::char_traits<char>_>::size
                            ((basic_string_view<char,_std::char_traits<char>_> *)&scope_local._M_str
                            );
      sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)&scope_local._M_str);
      local_120 = sVar4 + 1;
      local_118 = std::basic_string_view<char,_std::char_traits<char>_>::size
                            ((basic_string_view<char,_std::char_traits<char>_> *)&scope_local._M_str
                            );
      sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)&scope_local._M_str);
      local_110 = sVar4 + 1;
      local_108 = std::basic_string_view<char,_std::char_traits<char>_>::size
                            ((basic_string_view<char,_std::char_traits<char>_> *)&scope_local._M_str
                            );
      local_100 = &local_140;
      local_f8 = 8;
      bytes_01._M_len = local_a8;
      bytes_01._M_array = local_b0;
      sizes_01._M_len = 8;
      sizes_01._M_array = local_100;
      _Var9 = (_Optional_payload_base<google::protobuf::internal::DescriptorNames>)
              CreateDescriptorNames(this,bytes_01,sizes_01);
      local_10 = _Var9._M_engaged;
      goto LAB_002fb2cf;
    }
    if (FVar2 == 1) {
      internal::NoopDebugCounter::Inc
                ((NoopDebugCounter *)(camelcase_name_1.field_2._M_local_buf + 0xf));
      camelcase_offset = (size_t)scope_local._M_str;
      input._M_str = (char *)0x1;
      pcStack_170 = input._M_len;
      protobuf::(anonymous_namespace)::ToCamelCase_abi_cxx11_
                ((string *)local_168,(_anonymous_namespace_ *)scope_local._M_str,input,
                 (bool)lower_first);
      lVar7 = local_80;
      local_180 = std::__cxx11::string::size();
      local_180 = lVar7 + local_180;
      local_1f0 = (basic_string_view<char,_std::char_traits<char>_>)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_168);
      local_1e0 = AllocateFieldNames::kNullChar;
      local_1d0 = this_local;
      sStack_1c8 = scope_local._M_len;
      local_1c0 = full_name_size;
      sStack_1b8 = scope_dot._M_len;
      local_1b0 = scope_local._M_str;
      local_1a0 = AllocateFieldNames::kNullChar;
      local_190 = &local_1f0;
      local_188 = 6;
      this_00 = &scope_local._M_str;
      pcStack_1a8 = input._M_len;
      local_240 = std::basic_string_view<char,_std::char_traits<char>_>::size
                            ((basic_string_view<char,_std::char_traits<char>_> *)this_00);
      local_238 = local_80;
      sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)this_00);
      local_230 = sVar4 + 1;
      local_228 = std::basic_string_view<char,_std::char_traits<char>_>::size
                            ((basic_string_view<char,_std::char_traits<char>_> *)this_00);
      local_220 = local_180 + 2;
      local_218 = std::__cxx11::string::size();
      local_210 = local_180 + 2;
      local_208 = std::__cxx11::string::size();
      local_200 = &local_240;
      local_1f8 = 8;
      bytes_00._M_len = local_188;
      bytes_00._M_array = local_190;
      sizes_00._M_len = 8;
      sizes_00._M_array = local_200;
      oVar10 = CreateDescriptorNames(this,bytes_00,sizes_00);
      local_10 = oVar10.
                 super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>.
                 _M_payload.
                 super__Optional_payload_base<google::protobuf::internal::DescriptorNames>.
                 _M_engaged;
      std::__cxx11::string::~string((string *)local_168);
      _Var9._8_8_ = extraout_RDX;
      _Var9._M_payload =
           oVar10.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>.
           _M_payload.super__Optional_payload_base<google::protobuf::internal::DescriptorNames>.
           _M_payload;
      goto LAB_002fb2cf;
    }
  }
  internal::NoopDebugCounter::Inc((NoopDebugCounter *)(lowercase_name.field_2._M_local_buf + 0xb));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)local_270,
             (basic_string_view<char,_std::char_traits<char>_> *)&scope_local._M_str,
             (allocator<char> *)(camelcase_name.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(camelcase_name.field_2._M_local_buf + 0xf));
  absl::lts_20250127::AsciiStrToLower((Nonnull<std::string_*>)local_270);
  json_name.field_2._8_8_ = scope_local._M_str;
  input_00._M_str = (char *)0x1;
  input_00._M_len = (size_t)input._M_len;
  pcVar8 = (char *)0x1;
  protobuf::(anonymous_namespace)::ToCamelCase_abi_cxx11_
            ((string *)local_298,(_anonymous_namespace_ *)scope_local._M_str,input_00,
             (bool)lower_first);
  if (local_48 == (string *)0x0) {
    offset = (size_t)scope_local._M_str;
    input_01._M_str = pcVar8;
    input_01._M_len = (size_t)input._M_len;
    pcStack_2d0 = input._M_len;
    protobuf::(anonymous_namespace)::ToJsonName_abi_cxx11_
              ((string *)local_2c8,(_anonymous_namespace_ *)scope_local._M_str,input_01);
  }
  else {
    std::__cxx11::string::string((string *)local_2c8,(string *)local_48);
  }
  local_2e0 = local_80 + 1;
  local_390 = (basic_string_view<char,_std::char_traits<char>_>)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_2c8);
  local_380 = AllocateFieldNames::kNullChar;
  local_370 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_298);
  local_360 = AllocateFieldNames::kNullChar;
  local_350 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_270);
  local_340 = AllocateFieldNames::kNullChar;
  local_330 = this_local;
  sStack_328 = scope_local._M_len;
  local_320 = full_name_size;
  sStack_318 = scope_dot._M_len;
  local_310 = scope_local._M_str;
  local_300 = AllocateFieldNames::kNullChar;
  local_2f0 = &local_390;
  local_2e8 = 10;
  pcStack_308 = input._M_len;
  local_3e0 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)&scope_local._M_str);
  local_3d8 = local_80;
  lVar7 = std::__cxx11::string::size();
  local_3d0 = lVar7 + 1 + local_2e0;
  local_2e0 = local_3d0;
  local_3c8 = std::__cxx11::string::size();
  lVar7 = std::__cxx11::string::size();
  local_3c0 = lVar7 + 1 + local_2e0;
  local_2e0 = local_3c0;
  local_3b8 = std::__cxx11::string::size();
  lVar7 = std::__cxx11::string::size();
  local_3b0 = lVar7 + 1 + local_2e0;
  local_2e0 = local_3b0;
  local_3a8 = std::__cxx11::string::size();
  local_3a0 = &local_3e0;
  local_398 = 8;
  bytes._M_len = local_2e8;
  bytes._M_array = local_2f0;
  sizes._M_len = 8;
  sizes._M_array = local_3a0;
  oVar10 = CreateDescriptorNames(this,bytes,sizes);
  local_10 = oVar10.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>.
             _M_payload.super__Optional_payload_base<google::protobuf::internal::DescriptorNames>.
             _M_engaged;
  std::__cxx11::string::~string((string *)local_2c8);
  std::__cxx11::string::~string((string *)local_298);
  std::__cxx11::string::~string((string *)local_270);
  _Var9._8_8_ = extraout_RDX_00;
  _Var9._M_payload =
       oVar10.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>.
       _M_payload.super__Optional_payload_base<google::protobuf::internal::DescriptorNames>.
       _M_payload;
LAB_002fb2cf:
  name_local._M_str = (char *)_Var9._M_payload;
  oVar10.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>._M_payload.
  super__Optional_payload_base<google::protobuf::internal::DescriptorNames>._9_7_ = _Var9._9_7_;
  oVar10.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>._M_payload.
  super__Optional_payload_base<google::protobuf::internal::DescriptorNames>._M_engaged =
       (bool)local_10;
  oVar10.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>._M_payload.
  super__Optional_payload_base<google::protobuf::internal::DescriptorNames>._M_payload =
       (_Storage<google::protobuf::internal::DescriptorNames,_true>)name_local._M_str;
  return (optional<google::protobuf::internal::DescriptorNames>)
         oVar10.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>.
         _M_payload.super__Optional_payload_base<google::protobuf::internal::DescriptorNames>;
}

Assistant:

std::optional<internal::DescriptorNames> AllocateFieldNames(
      const absl::string_view name, const absl::string_view scope,
      const std::string* opt_json_name) {
    ABSL_CHECK(has_allocated());

    const absl::string_view scope_dot = scope.empty() ? "" : ".";
    const size_t full_name_size = scope.size() + scope_dot.size() + name.size();

    static constexpr absl::string_view kNullChar("\0", 1);

    if (opt_json_name == nullptr) {
      switch (GetFieldNameCase(name)) {
        case FieldNameCase::kAllLower:
          PROTOBUF_DEBUG_COUNTER("AllocateFieldNames.AllLower").Inc();
          // Case 1: they are all the same.
          return CreateDescriptorNames(
              {scope, scope_dot, name, kNullChar},
              {name.size(), full_name_size,
               /* lowercase */ name.size() + 1, name.size(),
               /* camelcase */ name.size() + 1, name.size(),
               /* json */ name.size() + 1, name.size()});
        case FieldNameCase::kSnakeCase: {
          PROTOBUF_DEBUG_COUNTER("AllocateFieldNames.SnakeCase").Inc();
          // Case 2: name==lower, camel==json
          std::string camelcase_name =
              ToCamelCase(name, /* lower_first = */ true);
          const size_t camelcase_offset =
              full_name_size + camelcase_name.size();
          return CreateDescriptorNames(
              {camelcase_name, kNullChar, scope, scope_dot, name, kNullChar},
              {name.size(), full_name_size,
               /* lowercase */ name.size() + 1, name.size(),
               /* camelcase */ camelcase_offset + 2, camelcase_name.size(),
               /* json */ camelcase_offset + 2, camelcase_name.size()});
        }
        default:
          break;
      }
    }

    PROTOBUF_DEBUG_COUNTER("AllocateFieldNames.Fallback").Inc();
    std::string lowercase_name = std::string(name);
    absl::AsciiStrToLower(&lowercase_name);
    const std::string camelcase_name =
        ToCamelCase(name, /* lower_first = */ true);
    const std::string json_name =
        opt_json_name != nullptr ? *opt_json_name : ToJsonName(name);

    size_t offset = full_name_size + 1;
    return CreateDescriptorNames(
        {json_name, kNullChar, camelcase_name, kNullChar,  //
         lowercase_name, kNullChar, scope, scope_dot, name, kNullChar},
        {name.size(), full_name_size,  //
         offset += lowercase_name.size() + 1, lowercase_name.size(),
         offset += camelcase_name.size() + 1, camelcase_name.size(),
         offset += json_name.size() + 1, json_name.size()});
  }